

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O1

size_t __thiscall
Assimp::MemoryIOStream::Read(MemoryIOStream *this,void *pvBuffer,size_t pSize,size_t pCount)

{
  ulong uVar1;
  
  if (pvBuffer == (void *)0x0) {
    __assert_fail("nullptr != pvBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/MemoryIOWrapper.h"
                  ,0x56,"virtual size_t Assimp::MemoryIOStream::Read(void *, size_t, size_t)");
  }
  if (pSize != 0) {
    uVar1 = (this->length - this->pos) / pSize;
    if (pCount <= uVar1) {
      uVar1 = pCount;
    }
    memcpy(pvBuffer,this->buffer + this->pos,pSize * uVar1);
    this->pos = this->pos + pSize * uVar1;
    return uVar1;
  }
  __assert_fail("0 != pSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/MemoryIOWrapper.h"
                ,0x57,"virtual size_t Assimp::MemoryIOStream::Read(void *, size_t, size_t)");
}

Assistant:

size_t Read(void* pvBuffer, size_t pSize, size_t pCount)    {
        ai_assert(nullptr != pvBuffer);
        ai_assert(0 != pSize);
        
        const size_t cnt = std::min( pCount, (length-pos) / pSize);
        const size_t ofs = pSize * cnt;

        ::memcpy(pvBuffer,buffer+pos,ofs);
        pos += ofs;

        return cnt;
    }